

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vec4f * __thiscall
DepthShader::vertex(vec4f *__return_storage_ptr__,DepthShader *this,Model *model,int iface,
                   int nthvert)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  size_t i;
  bool bVar5;
  undefined4 uVar6;
  double ret_1;
  undefined4 uVar7;
  vec<4UL,_double> ret;
  vec<4UL,_double> ret_2;
  vec<3UL,_double> ret_3;
  double local_148 [4];
  mat<4UL,_4UL> local_128;
  mat<4UL,_4UL> local_a8;
  
  Model::vert((vec3f *)&local_128,model,(long)iface,(long)nthvert);
  __return_storage_ptr__->data[2] = 0.0;
  __return_storage_ptr__->data[3] = 0.0;
  __return_storage_ptr__->data[0] = 0.0;
  __return_storage_ptr__->data[1] = 0.0;
  i = 3;
  do {
    uVar7 = 0x3ff00000;
    uVar6 = 0;
    if (i + 1 < 4) {
      dVar1 = vec<3UL,_double>::operator[]((vec3f *)&local_128,i);
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    __return_storage_ptr__->data[i] = (double)CONCAT44(uVar7,uVar6);
    bVar5 = i != 0;
    i = i - 1;
  } while (bVar5);
  operator*(&local_a8,&(this->super_IShader).uniform_Viewport,
            &(this->super_IShader).uniform_Projection);
  operator*(&local_128,&local_a8,&(this->super_IShader).uniform_ModelView);
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  lVar2 = 4;
  pdVar3 = local_128.rows[3].data + 3;
  do {
    lVar2 = lVar2 + -1;
    dVar1 = 0.0;
    lVar4 = 0;
    do {
      dVar1 = dVar1 + pdVar3[lVar4] * __return_storage_ptr__->data[lVar4 + 3];
      lVar4 = lVar4 + -1;
    } while (lVar4 != -4);
    local_148[lVar2] = dVar1;
    pdVar3 = pdVar3 + -4;
  } while (lVar2 != 0);
  __return_storage_ptr__->data[2] = local_148[2];
  __return_storage_ptr__->data[3] = local_148[3];
  __return_storage_ptr__->data[0] = local_148[0];
  __return_storage_ptr__->data[1] = local_148[1];
  local_128.rows[0].data[2] = __return_storage_ptr__->data[2];
  local_128.rows[0].data[3] = __return_storage_ptr__->data[3];
  local_128.rows[0].data[0] = __return_storage_ptr__->data[0];
  local_128.rows[0].data[1] = __return_storage_ptr__->data[1];
  dVar1 = __return_storage_ptr__->data[3];
  lVar2 = 3;
  do {
    local_128.rows[0].data[lVar2] = local_128.rows[0].data[lVar2] / dVar1;
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  local_a8.rows[0].data[0] = 0.0;
  local_a8.rows[0].data[1] = 0.0;
  local_a8.rows[0].data[2] = 0.0;
  lVar2 = 3;
  do {
    lVar4 = (ulong)(lVar2 != 2) * 8 + 8;
    if (lVar2 == 1) {
      lVar4 = 0;
    }
    *(double *)((long)local_a8.rows[0].data + lVar4) = local_128.rows[0].data[lVar2 + -1];
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  mat<3UL,_3UL>::set_col(&this->varying_tri,(long)nthvert,(vec<3UL,_double> *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));  // read the vertex from .obj file
        gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                    gl_Vertex;  // transform it to screen coordinates
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }